

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_string.c
# Opt level: O3

int parseConvertElement(mpt_convertable *conv,mpt_type_t type,void *dest)

{
  byte bVar1;
  ushort uVar2;
  ushort *puVar3;
  _func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **pp_Var4;
  ushort **ppuVar5;
  char *pcVar6;
  _mpt_vptr_convertable *p_Var7;
  mpt_convertable *sep;
  long lVar8;
  iovec *vec;
  size_t klen;
  _mpt_vptr_convertable *local_30;
  size_t local_28;
  
  p_Var7 = conv[4]._vptr;
  if (p_Var7 == (_mpt_vptr_convertable *)0x0) {
    return 0;
  }
  if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
    *(undefined1 *)&(conv[6]._vptr)->convert = *(undefined1 *)&conv[7]._vptr;
  }
  lVar8 = (long)*(char *)&p_Var7->convert;
  if (lVar8 == 0) {
    if (type != 0x73) {
      if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
        conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
        return -0x10;
      }
      return -0x10;
    }
    if (dest != (void *)0x0) {
      *(undefined8 *)dest = 0;
    }
  }
  else {
    local_30 = p_Var7;
    if (type == 0x73) {
      ppuVar5 = __ctype_b_loc();
      bVar1 = *(byte *)((long)*ppuVar5 + lVar8 * 2 + 1);
      while ((bVar1 & 0x20) != 0) {
        pp_Var4 = &p_Var7->convert;
        p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + 1);
        bVar1 = *(byte *)((long)*ppuVar5 + (long)*(char *)((long)pp_Var4 + 1) * 2 + 1);
      }
      if (dest != (void *)0x0) {
        *(_mpt_vptr_convertable **)dest = p_Var7;
      }
    }
    else {
      if (type == 0x6b) {
        sep = (mpt_convertable *)0x0;
        if (*(char *)&conv[8]._vptr != '\0') {
          sep = conv + 8;
        }
        pcVar6 = mpt_convert_key((char **)&local_30,(char *)sep,&local_28);
        if (pcVar6 == (char *)0x0) {
          if (conv[6]._vptr != (_mpt_vptr_convertable *)0x0) {
            conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
          }
          return -2;
        }
        if (dest != (void *)0x0) {
          *(char **)dest = pcVar6;
        }
        p_Var7 = conv[4]._vptr;
        local_30._0_4_ = (int)local_30 - (int)p_Var7;
      }
      else {
        if (type == 0x43) {
          ppuVar5 = __ctype_b_loc();
          puVar3 = *ppuVar5;
          uVar2 = puVar3[lVar8];
          while ((uVar2 >> 0xd & 1) != 0) {
            p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + 1);
            local_30 = p_Var7;
            uVar2 = puVar3[*(char *)&p_Var7->convert];
          }
          if ((uVar2 >> 0xd & 1) == 0) {
            do {
              p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + 1);
              local_30 = p_Var7;
            } while ((*(byte *)((long)puVar3 + (long)*(char *)&p_Var7->convert * 2 + 1) & 0x20) == 0
                    );
          }
          conv[6]._vptr = p_Var7;
          *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&p_Var7->convert;
          *(undefined1 *)&p_Var7->convert = 0;
          if (dest != (void *)0x0) {
            p_Var7 = conv[4]._vptr;
            *(_mpt_vptr_convertable **)dest = p_Var7;
            *(long *)((long)dest + 8) = (long)local_30 - (long)p_Var7;
            return 0x73;
          }
          return 0x73;
        }
        local_30._0_4_ = mpt_convert_string((char *)conv[4]._vptr,type,dest);
        if ((int)local_30 < 0) {
          return (int)local_30;
        }
        p_Var7 = conv[4]._vptr;
      }
      p_Var7 = (_mpt_vptr_convertable *)((long)&p_Var7->convert + (long)(int)local_30);
      conv[6]._vptr = p_Var7;
      if (p_Var7 < conv[5]._vptr) {
        *(undefined1 *)&conv[7]._vptr = *(undefined1 *)&p_Var7->convert;
        *(undefined1 *)&p_Var7->convert = 0;
        return 0x73;
      }
    }
  }
  conv[6]._vptr = (_mpt_vptr_convertable *)0x0;
  return 0x73;
}

Assistant:

static int parseConvertElement(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *dest)
{
	MPT_STRUCT(parseIterator) *it = MPT_baseaddr(parseIterator, conv, elem._conv);
	const char *txt;
	int len;
	
	/* indicate consumed value */
	if (!(txt = it->val)) {
		return 0;
	}
	/* reset value end indicator */
	if (it->restore) {
		*it->restore = it->save;
	}
	if (!*txt) {
		if (type == 's') {
			if (dest) ((char **) dest)[0] = 0;
			it->restore = 0;
			return 's';
		}
		if (it->restore) {
			it->restore = 0;
		}
		return MPT_ERROR(MissingData);
	}
	/* return full remaining data */
	if (type == 's') {
		while (isspace(*txt)) ++txt;
		if (dest) *((const char **) dest) = txt;
		it->restore = 0;
		return 's';
	}
	if (type == MPT_type_toVector('c')) {
		while (isspace(*txt)) ++txt;
		while (!isspace(*txt)) ++txt;
		it->restore = (char *) txt;
		it->save = *txt;
		*it->restore = 0;
		if (dest) {
			struct iovec *vec = dest;
			vec->iov_base = it->val;
			vec->iov_len = txt - it->val;
		}
		return 's';
	}
	/* consume next complete word */
	if (type == 'k') {
		const char *sep = (char *) (it + 1);
		const char *key;
		size_t klen;
		if (!(key = mpt_convert_key(&txt, *sep ? sep : 0, &klen))) {
			if (it->restore) {
				it->restore = 0;
			}
			return MPT_ERROR(BadValue);
		}
		if (dest) {
			((const char **) dest)[0] = key;
		}
		len = txt - it->val;
	}
	/* convert to target type */
	else if ((len = mpt_convert_string(it->val, type, dest)) < 0) {
		return len;
	}
	/* terminate consumed substring */
	it->restore = it->val + len;
	if (it->restore >= it->end) {
		it->restore = 0;
	} else {
		it->save = *it->restore;
		*it->restore = 0;
	}
	return 's';
}